

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t **pvSyms)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t KVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((iLit & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x124,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
  }
  uVar10 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar1 <= uVar10) {
LAB_004488d1:
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if ((uVar1 <= uVar10) &&
     (pKVar4 = p->pNodes[(ulong)uVar10 - (ulong)uVar1], pKVar4 != (Kit_DsdObj_t *)0x0)) {
    KVar5 = *pKVar4;
    if (0x3ffffff < (uint)KVar5) {
      uVar9 = 0;
      do {
        Amap_CreateCheckAsym_rec
                  (p,*(ushort *)((long)&pKVar4[1].field_0x0 + uVar9 * 2) & 0xfffffffe,pvSyms);
        uVar9 = uVar9 + 1;
        KVar5 = *pKVar4;
      } while (uVar9 < (uint)KVar5 >> 0x1a);
    }
    uVar10 = (uint)KVar5 >> 6 & 7;
    if (uVar10 - 3 < 2) {
      if (0x3ffffff < (uint)KVar5) {
        uVar11 = 1;
        uVar9 = 0;
        do {
          uVar8 = uVar9 + 1;
          uVar7 = (ulong)((uint)KVar5 >> 0x1a);
          uVar12 = uVar11;
          if (uVar8 < uVar7) {
            do {
              uVar1 = *(ushort *)((long)&pKVar4[1].field_0x0 + uVar9 * 2);
              uVar2 = *(ushort *)((long)&pKVar4[1].field_0x0 + uVar12 * 2);
              if (((uVar2 ^ uVar1) & 1) != 0) {
                uVar1 = uVar1 >> 1;
                uVar3 = p->nVars;
                uVar10 = (uint)p->nNodes + (uint)uVar3;
                if (uVar10 <= uVar1) goto LAB_004488d1;
                if (((uint)uVar1 < (uint)uVar3) ||
                   (p->pNodes[(ulong)(uint)uVar1 - (ulong)uVar3] == (Kit_DsdObj_t *)0x0)) {
                  uVar2 = uVar2 >> 1;
                  if (uVar10 <= uVar2) goto LAB_004488d1;
                  uVar10 = (uint)uVar2;
                  if ((uVar10 < uVar3) ||
                     (p->pNodes[(ulong)uVar10 - (ulong)uVar3] == (Kit_DsdObj_t *)0x0)) {
                    p_00 = *pvSyms;
                    if (p_00 == (Vec_Int_t *)0x0) {
                      p_00 = (Vec_Int_t *)malloc(0x10);
                      p_00->nCap = 0x10;
                      p_00->nSize = 0;
                      piVar6 = (int *)malloc(0x40);
                      p_00->pArray = piVar6;
                      *pvSyms = p_00;
                    }
                    Vec_IntPush(p_00,(uint)uVar1 << 8 | uVar10);
                    KVar5 = *pKVar4;
                  }
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (uint)KVar5 >> 0x1a);
            uVar7 = (ulong)((uint)KVar5 >> 0x1a);
          }
          uVar11 = uVar11 + 1;
          uVar9 = uVar8;
        } while (uVar8 < uVar7);
      }
    }
    else if (uVar10 != 5) {
      __assert_fail("pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                    ,300,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
    }
  }
  return;
}

Assistant:

void Amap_CreateCheckAsym_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t ** pvSyms )
{
    Kit_DsdObj_t * pObj; 
    int i, k, iFanin;
    assert( !Abc_LitIsCompl(iLit) );
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return;
    Kit_DsdObjForEachFanin( p, pObj, iFanin, i )
        Amap_CreateCheckAsym_rec( p, Abc_LitRegular(iFanin), pvSyms );
    if ( pObj->Type == KIT_DSD_PRIME )
        return;
    assert( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj->nFans; i++ )
    for ( k = i+1; k < (int)pObj->nFans; k++ )
    {
        if ( Abc_LitIsCompl(pObj->pFans[i]) != Abc_LitIsCompl(pObj->pFans[k]) && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[i])) == NULL && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[k])) == NULL )
        {
            if ( *pvSyms == NULL )
                *pvSyms = Vec_IntAlloc( 16 );
            Vec_IntPush( *pvSyms, (Abc_Lit2Var(pObj->pFans[i]) << 8) | Abc_Lit2Var(pObj->pFans[k]) );
        }
    }
}